

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O1

double mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                 (PLConstraint *con,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pdVar4;
  long lVar5;
  PLPoints *this;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  this = PLConParams::GetPLPoints
                   (&(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                     params_);
  dVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start
          [(con->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).args_.
           _M_elems[0]];
  pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar9 = *pdVar2;
  if (dVar9 <= dVar1) {
    pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    if (dVar1 < *pdVar3 || dVar1 == *pdVar3) {
      lVar6 = -0x200000000;
      lVar5 = 0;
      do {
        lVar7 = lVar5;
        lVar6 = lVar6 + 0x100000000;
        dVar9 = *(double *)((long)pdVar2 + lVar7);
        lVar5 = lVar7 + 8;
      } while (dVar9 < dVar1);
      if ((dVar9 != dVar1) || (NAN(dVar9) || NAN(dVar1))) {
        pdVar4 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar8 = *(double *)((long)pdVar4 + (lVar6 >> 0x1d));
        dVar10 = *(double *)((long)pdVar2 + (lVar6 >> 0x1d));
        dVar8 = ((dVar1 - dVar10) * (*(double *)((long)pdVar4 + lVar7) - dVar8)) / (dVar9 - dVar10)
                + dVar8;
      }
      else {
        dVar8 = *(double *)
                 ((long)(this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
      }
    }
    else {
      dVar8 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      dVar9 = PLPoints::PostSlope(this);
      dVar8 = dVar9 * (dVar1 - (this->x_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish[-1]) + dVar8;
    }
  }
  else {
    pdVar3 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = *pdVar3;
    dVar10 = 0.0;
    if ((8 < (ulong)((long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar2)) && (dVar9 < pdVar2[1])
       ) {
      dVar10 = (pdVar3[1] - dVar8) / (pdVar2[1] - dVar9);
    }
    dVar8 = dVar8 - (dVar9 - dVar1) * dVar10;
  }
  return dVar8;
}

Assistant:

double ComputeValue(const PLConstraint& con, const VarVec& x) {
  const auto& plp = con.GetParameters().GetPLPoints();
  assert(!plp.empty());
  auto x0 = x[con.GetArguments()[0]];        // position
  if (x0<plp.x_.front())
    return plp.y_.front()
        - plp.PreSlope()*(plp.x_.front() - x0);
  if (x0>plp.x_.back())
    return plp.y_.back()
        + plp.PostSlope()*(x0 - plp.x_.back());
  int i0=0;
  for ( ; x0 > plp.x_[i0]; ++i0) ;
  return plp.x_[i0]==x0
      ? plp.y_[i0]
        : (plp.y_[i0-1]
           + (plp.y_[i0]-plp.y_[i0-1])
        * (x0-plp.x_[i0-1]) / (plp.x_[i0]-plp.x_[i0-1]));
}